

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,Handle lt,Handle rt)

{
  bool bVar1;
  mapped_type *pmVar2;
  Handle in_RSI;
  C in_RDI;
  bool unaff_retaddr;
  Relations *in_stack_00000008;
  Bucket *in_stack_00000010;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_00000018;
  Handle in_stack_00000020;
  ValueRelations *in_stack_00000028;
  Relations result;
  Bucket *in_stack_ffffffffffffff88;
  _Base_bitset<1UL> this_00;
  Handle in_stack_ffffffffffffffb0;
  ValueRelations *in_stack_ffffffffffffffb8;
  key_type *in_stack_ffffffffffffffc8;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffffd0;
  bitset<12UL> local_8;
  
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::reference_wrapper<dg::vr::Bucket_const>::
  reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
            ((reference_wrapper<const_dg::vr::Bucket> *)in_RDI,in_stack_ffffffffffffff88);
  pmVar2 = std::
           map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
           ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_8.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)(pmVar2->bits).super__Base_bitset<1UL>._M_w;
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x208596);
  bVar1 = Relations::any((Relations *)0x2085a0);
  if (!bVar1) {
    getInstance<llvm::ConstantInt>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_8.super__Base_bitset<1UL>._M_w =
         (_Base_bitset<1UL>)_between(in_stack_00000028,in_stack_00000020,(C)in_stack_00000018);
    this_00._M_w = (_WordT)local_8.super__Base_bitset<1UL>._M_w;
    bVar1 = Relations::any((Relations *)0x2085f4);
    if (!bVar1) {
      getInstance<llvm::ConstantInt>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      local_8.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)_between((ValueRelations *)this_00._M_w,in_RDI,in_RSI);
    }
  }
  return (Relations)local_8.super__Base_bitset<1UL>._M_w._M_w;
}

Assistant:

Relations ValueRelations::_between(Handle lt, Handle rt) const {
    Relations result = graph.getRelated(lt, allRelations)[rt];
    if (result.any())
        return result;
    result = _between(lt, getInstance<llvm::ConstantInt>(rt));
    if (result.any())
        return result;
    return _between(getInstance<llvm::ConstantInt>(lt), rt);
}